

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerInvisibility::EndEffect(APowerInvisibility *this)

{
  TObjPtr<AActor> *obj;
  uint uVar1;
  bool bVar2;
  AActor *pAVar3;
  AInventory *this_00;
  
  APowerup::EndEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar3 != (AActor *)0x0) {
    uVar1 = (this->super_APowerup).super_AInventory.super_AActor.flags.Value;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar3->flags).Value = (pAVar3->flags).Value & (~uVar1 | 0xfffbffff);
    uVar1 = (this->super_APowerup).super_AInventory.super_AActor.flags3.Value;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar3->flags3).Value = (pAVar3->flags3).Value & (~uVar1 | 0xfffffff7);
    uVar1 = (this->super_APowerup).super_AInventory.super_AActor.flags5.Value;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    (pAVar3->flags5).Value = (pAVar3->flags5).Value & (~uVar1 | 0xefffffff);
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar3->RenderStyle = LegacyRenderStyles[1];
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar3->Alpha = 1.0;
    this_00 = (AInventory *)GC::ReadBarrier<AActor>((AActor **)obj);
    while( true ) {
      this_00 = GC::ReadBarrier<AInventory>((AInventory **)&(this_00->super_AActor).Inventory);
      if (this_00 == (AInventory *)0x0) break;
      bVar2 = DObject::IsKindOf((DObject *)this_00,RegistrationInfo.MyClass);
      if ((this_00 != (AInventory *)this) && (bVar2)) {
        (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])(this_00);
      }
    }
  }
  return;
}

Assistant:

void APowerInvisibility::EndEffect ()
{
	Super::EndEffect();
	if (Owner != NULL)
	{
		Owner->flags  &= ~(flags  & INVISIBILITY_FLAGS1);
		Owner->flags3 &= ~(flags3 & INVISIBILITY_FLAGS3);
		Owner->flags5 &= ~(flags5 & INVISIBILITY_FLAGS5);

		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;

		// Check whether there are other invisibility items and refresh their effect.
		// If this isn't done there will be one incorrectly drawn frame when this
		// item expires.
		AInventory *item = Owner->Inventory;
		while (item != NULL)
		{
			if (item->IsKindOf(RUNTIME_CLASS(APowerInvisibility)) && item != this)
			{
				static_cast<APowerInvisibility*>(item)->DoEffect();
			}
			item = item->Inventory;
		}
	}
}